

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<deqp::gls::BuiltinPrecisionTests::Void> * deqp::gls::BuiltinPrecisionTests::voidP(void)

{
  int iVar1;
  Void local_9;
  
  if (voidP()::singleton == '\0') {
    iVar1 = __cxa_guard_acquire(&voidP()::singleton);
    if (iVar1 != 0) {
      Void::Void(&local_9);
      constant<deqp::gls::BuiltinPrecisionTests::Void>
                ((BuiltinPrecisionTests *)&voidP::singleton,&local_9);
      __cxa_atexit(ExprP<deqp::gls::BuiltinPrecisionTests::Void>::~ExprP,&voidP::singleton,
                   &__dso_handle);
      __cxa_guard_release(&voidP()::singleton);
    }
  }
  return &voidP::singleton;
}

Assistant:

const ExprP<Void>& voidP (void)
{
	static const ExprP<Void> singleton = constant(Void());

	return singleton;
}